

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsproto.c
# Opt level: O0

int lprotocol(lua_State *L)

{
  int iVar1;
  sproto *sp_00;
  lua_Integer lVar2;
  char *pcVar3;
  sproto_type *psVar4;
  char *name_1;
  char *name;
  int tag;
  int t;
  sproto_type *response;
  sproto_type *request;
  sproto *sp;
  lua_State *L_local;
  
  sp_00 = (sproto *)lua_touserdata(L,1);
  if (sp_00 == (sproto *)0x0) {
    L_local._4_4_ = luaL_argerror(L,1,"Need a sproto_type object");
  }
  else {
    iVar1 = lua_type(L,2);
    if (iVar1 == 3) {
      lVar2 = lua_tointegerx(L,2,(int *)0x0);
      name._0_4_ = (int)lVar2;
      pcVar3 = sproto_protoname(sp_00,(int)name);
      if (pcVar3 == (char *)0x0) {
        return 0;
      }
      lua_pushstring(L,pcVar3);
    }
    else {
      pcVar3 = lua_tolstring(L,2,(size_t *)0x0);
      name._0_4_ = sproto_prototag(sp_00,pcVar3);
      if ((int)name < 0) {
        return 0;
      }
      lua_pushinteger(L,(long)(int)name);
    }
    psVar4 = sproto_protoquery(sp_00,(int)name,0);
    if (psVar4 == (sproto_type *)0x0) {
      lua_pushnil(L);
    }
    else {
      lua_pushlightuserdata(L,psVar4);
    }
    psVar4 = sproto_protoquery(sp_00,(int)name,1);
    if (psVar4 == (sproto_type *)0x0) {
      lua_pushnil(L);
    }
    else {
      lua_pushlightuserdata(L,psVar4);
    }
    L_local._4_4_ = 3;
  }
  return L_local._4_4_;
}

Assistant:

static int
lprotocol(lua_State *L) {
	struct sproto * sp = lua_touserdata(L, 1);
	struct sproto_type * request;
	struct sproto_type * response;
	int t;
	int tag;
	if (sp == NULL) {
		return luaL_argerror(L, 1, "Need a sproto_type object");
	}
	t = lua_type(L,2);
	if (t == LUA_TNUMBER) {
		const char * name;
		tag = lua_tointeger(L, 2);
		name = sproto_protoname(sp, tag);
		if (name == NULL)
			return 0;
		lua_pushstring(L, name);
	} else {
		const char * name = lua_tostring(L, 2);
		tag = sproto_prototag(sp, name);
		if (tag < 0)
			return 0;
		lua_pushinteger(L, tag);
	}
	request = sproto_protoquery(sp, tag, SPROTO_REQUEST);
	if (request == NULL) {
		lua_pushnil(L);
	} else {
		lua_pushlightuserdata(L, request);
	}
	response = sproto_protoquery(sp, tag, SPROTO_RESPONSE);
	if (response == NULL) {
		lua_pushnil(L);
	} else {
		lua_pushlightuserdata(L, response);
	}
	return 3;
}